

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O0

void __thiscall
QScrollbarStyleAnimation::QScrollbarStyleAnimation
          (QScrollbarStyleAnimation *this,Mode mode,QObject *target)

{
  int in_ESI;
  QObject *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  QNumberStyleAnimation::QNumberStyleAnimation
            ((QNumberStyleAnimation *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_RDI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d0dfe0;
  *(int *)((QStyleAnimation *)in_RDI + 0x40) = in_ESI;
  ((QStyleAnimation *)in_RDI)[0x44] = (QStyleAnimation)0x0;
  if (in_ESI == 0) {
    QStyleAnimation::setDuration((QStyleAnimation *)in_RDI,200);
    QNumberStyleAnimation::setStartValue((QNumberStyleAnimation *)in_RDI,0.0);
    QNumberStyleAnimation::setEndValue((QNumberStyleAnimation *)in_RDI,1.0);
  }
  else if (in_ESI == 1) {
    QStyleAnimation::setDuration((QStyleAnimation *)in_RDI,0x28a);
    QStyleAnimation::setDelay((QStyleAnimation *)in_RDI,0x1c2);
    QNumberStyleAnimation::setStartValue((QNumberStyleAnimation *)in_RDI,1.0);
    QNumberStyleAnimation::setEndValue((QNumberStyleAnimation *)in_RDI,0.0);
  }
  return;
}

Assistant:

QScrollbarStyleAnimation::QScrollbarStyleAnimation(Mode mode, QObject *target) : QNumberStyleAnimation(target), _mode(mode), _active(false)
{
    switch (mode) {
    case Activating:
        setDuration(ScrollBarFadeOutDuration);
        setStartValue(0.0);
        setEndValue(1.0);
        break;
    case Deactivating:
        setDuration(ScrollBarFadeOutDelay + ScrollBarFadeOutDuration);
        setDelay(ScrollBarFadeOutDelay);
        setStartValue(1.0);
        setEndValue(0.0);
        break;
    }
}